

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

MPP_RET cluster_worker_deinit(ClusterWorker *p)

{
  MppThread *this;
  int iVar1;
  ClusterWorker *p_local;
  
  if (p->thd != (MppThread *)0x0) {
    MppThread::stop(p->thd);
    this = p->thd;
    if (this != (MppThread *)0x0) {
      MppThread::~MppThread(this);
      operator_delete(this,0x198);
    }
    p->thd = (MppThread *)0x0;
  }
  iVar1 = list_empty(&p->list_task);
  if ((iVar1 == 0) &&
     (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "list_empty(&p->list_task)","cluster_worker_deinit",0x184),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((p->work_count != 0) &&
     (_mpp_log_l(2,"mpp_cluster","Assertion %s failed at %s:%d\n",(char *)0x0,"p->work_count == 0",
                 "cluster_worker_deinit",0x185), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  p->batch_count = 0;
  p->cluster = (MppCluster *)0x0;
  return MPP_OK;
}

Assistant:

MPP_RET cluster_worker_deinit(ClusterWorker *p)
{
    if (p->thd) {
        p->thd->stop();
        delete p->thd;
        p->thd = NULL;
    }

    mpp_assert(list_empty(&p->list_task));
    mpp_assert(p->work_count == 0);

    p->batch_count = 0;
    p->cluster = NULL;

    return MPP_OK;
}